

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsearch.c
# Opt level: O0

void * bsearch(void *__key,void *__base,size_t __nmemb,size_t __size,__compar_fn_t __compar)

{
  int iVar1;
  ulong uVar2;
  void *pvVar3;
  size_t corr;
  int rc;
  void *pivot;
  _func_int_void_ptr_void_ptr *compar_local;
  size_t size_local;
  size_t nmemb_local;
  void *base_local;
  void *key_local;
  
  size_local = __nmemb;
  nmemb_local = (size_t)__base;
  do {
    while( true ) {
      if (size_local == 0) {
        return (void *)0x0;
      }
      uVar2 = size_local & 1;
      size_local = size_local >> 1;
      pvVar3 = (void *)(nmemb_local + size_local * __size);
      iVar1 = (*__compar)(__key,pvVar3);
      if (iVar1 < 1) break;
      nmemb_local = (long)pvVar3 + __size;
      size_local = size_local - (1 - uVar2);
    }
  } while (iVar1 != 0);
  return pvVar3;
}

Assistant:

void * bsearch( const void * key, const void * base, size_t nmemb, size_t size, int ( *compar )( const void *, const void * ) )
{
    const void * pivot;
    int rc;
    size_t corr;

    while ( nmemb )
    {
        /* algorithm needs -1 correction if remaining elements are an even number. */
        corr = nmemb % 2;
        nmemb /= 2;
        pivot = ( const char * )base + ( nmemb * size );
        rc = compar( key, pivot );

        if ( rc > 0 )
        {
            base = ( const char * )pivot + size;
            /* applying correction */
            nmemb -= ( 1 - corr );
        }
        else if ( rc == 0 )
        {
            return ( void * )pivot;
        }
    }

    return NULL;
}